

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

string * anon_unknown.dwarf_14d664b::TargetId
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *topBuild)

{
  cmLocalGenerator *this;
  string *psVar1;
  string_view input;
  cmCryptoHash hasher;
  string hash;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cmCryptoHash::cmCryptoHash(&hasher,AlgoSHA3_256);
  this = cmGeneratorTarget::GetLocalGenerator(gt);
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmSystemTools::RelativeIfUnder(&path,topBuild,psVar1);
  input._M_str = path._M_dataplus._M_p;
  input._M_len = path._M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&hash,&hasher,input);
  std::__cxx11::string::resize((ulong)&hash,'\x14');
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  std::operator+(&local_38,psVar1,"::@");
  std::operator+(__return_storage_ptr__,&local_38,&hash);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)&path);
  cmCryptoHash::~cmCryptoHash(&hasher);
  return __return_storage_ptr__;
}

Assistant:

std::string TargetId(cmGeneratorTarget const* gt, std::string const& topBuild)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string path = RelativeIfUnder(
    topBuild, gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
  std::string hash = hasher.HashString(path);
  hash.resize(20, '0');
  return gt->GetName() + CMAKE_DIRECTORY_ID_SEP + hash;
}